

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O3

bool __thiscall helics::fileops::looksLikeConfigJson(fileops *this,string_view jsonString)

{
  string_view jsonString_00;
  long lVar1;
  size_type sVar2;
  ulong __n_00;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  char *__s;
  long lVar6;
  size_type __n;
  string_view sVar7;
  char *in_stack_ffffffffffffffd8;
  string_view local_20;
  
  local_20._M_str = (char *)jsonString._M_len;
  local_20._M_len = (size_t)this;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_20,"\n#",0,2);
  if (sVar2 != 0xffffffffffffffff) {
    return false;
  }
  sVar7._M_str = in_stack_ffffffffffffffd8;
  sVar7._M_len = 0x357be4;
  local_20 = removeSpaceAndComment(sVar7);
  __s = local_20._M_str;
  __n_00 = local_20._M_len;
  if ((6 < __n_00) && (*__s == '{')) {
    uVar3 = 0;
    do {
      if ((__s[uVar3] == '\"') || (__s[uVar3] == '\'')) {
        pvVar4 = memchr(__s,0x3a,__n_00);
        if ((long)pvVar4 - (long)__s == -1 || pvVar4 == (void *)0x0) {
          return false;
        }
        lVar5 = -1;
        lVar6 = -1;
        do {
          if (lVar6 - __n_00 == -1) {
            return false;
          }
          lVar6 = lVar6 + 1;
          lVar1 = lVar5 + __n_00;
          lVar5 = lVar5 + -1;
        } while (__s[lVar1] != '}');
        jsonString_00._M_str = in_stack_ffffffffffffffd8;
        jsonString_00._M_len = 0x357c7f;
        sVar7 = removeSpaceAndComment(jsonString_00);
        return sVar7._M_len == 0;
      }
      uVar3 = uVar3 + 1;
    } while (__n_00 != uVar3);
  }
  return false;
}

Assistant:

bool looksLikeConfigJson(std::string_view jsonString)
{
    if (jsonString.find("\n#") != std::string_view::npos) {
        return false;
    }
    jsonString = removeSpaceAndComment(jsonString);
    if (jsonString.size() < 7) {
        // minimum viable config file is 7 characters {"f":4}
        return false;
    }

    if (jsonString.front() != '{') {
        return false;
    }
    auto firstQuote = jsonString.find_first_of("\"'");
    if (firstQuote == std::string_view::npos) {
        return false;
    }
    auto firstColonLoc = jsonString.find_first_of(':');
    if (firstColonLoc == std::string_view::npos) {
        return false;
    }
    auto closeBracket = jsonString.find_last_of('}');
    if (closeBracket == std::string_view::npos) {
        return false;
    }

    auto afterBracket = removeSpaceAndComment(jsonString.substr(closeBracket + 1));
    return afterBracket.empty();
}